

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volid_test.cpp
# Opt level: O2

void generate_reference_file
               (string *idfileLocation,IDENTIFICATION_STRATEGY *strategies,int num_strategies)

{
  FUNCTION_RETURN FVar1;
  ostream *poVar2;
  long lVar3;
  PcSignature identifier_out;
  ofstream idfile;
  
  std::ofstream::ofstream((ostream *)&idfile,(string *)idfileLocation,_S_out);
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 4) {
      std::ofstream::close();
      std::ofstream::~ofstream(&idfile);
      return;
    }
    FVar1 = generate_user_pc_signature(identifier_out,strategies[lVar3]);
    if (FVar1 != FUNC_RET_OK) break;
    poVar2 = std::operator<<((ostream *)&idfile,identifier_out);
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar3 = lVar3 + 1;
  }
  __assert_fail("generate_ok == FUNC_RET_OK",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
                ,0x35,"void generate_reference_file(const string &, IDENTIFICATION_STRATEGY *, int)"
               );
}

Assistant:

static void generate_reference_file(const string& idfileLocation,
		IDENTIFICATION_STRATEGY strategies[], int num_strategies) {
	ofstream idfile(idfileLocation);
	PcSignature identifier_out;
	for (int i = 0; i < num_strategies; i++) {
		FUNCTION_RETURN generate_ok = generate_user_pc_signature(identifier_out,
				strategies[i]);
        BOOST_ASSERT(generate_ok == FUNC_RET_OK);
		if (generate_ok != FUNC_RET_OK){
			BOOST_ERROR("Generating identifier for strategy " << strategies[i] << " failed with: " << generate_ok);
            idfile << "0000-0000-0000-0000" << endl;
		}
        else
            idfile << identifier_out << endl;
	}
	idfile.close();
}